

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9MemObjInitFromString(jx9_vm *pVm,jx9_value *pObj,SyString *pVal)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)&pObj->x + uVar2 + 4) = 0;
    uVar2 = uVar2 + 4;
  } while (uVar2 < 0x3c);
  pObj->pVm = pVm;
  (pObj->sBlob).pBlob = (void *)0x0;
  (pObj->sBlob).nByte = 0;
  (pObj->sBlob).mByte = 0;
  (pObj->sBlob).pAllocator = &pVm->sAllocator;
  (pObj->sBlob).nFlags = 0;
  if (pVal != (SyString *)0x0) {
    uVar1 = SyBlobAppend(&pObj->sBlob,pVal->zString,pVal->nByte);
    uVar2 = (ulong)uVar1;
  }
  pObj->iFlags = 1;
  return (sxi32)uVar2;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjInitFromString(jx9_vm *pVm, jx9_value *pObj, const SyString *pVal)
{
	/* Zero the structure */
	SyZero(pObj, sizeof(jx9_value));
	/* Initialize fields */
	pObj->pVm = pVm;
	SyBlobInit(&pObj->sBlob, &pVm->sAllocator);
	if( pVal ){
		/* Append contents */
		SyBlobAppend(&pObj->sBlob, (const void *)pVal->zString, pVal->nByte);
	}
	/* Set the desired type */
	pObj->iFlags = MEMOBJ_STRING;
	return SXRET_OK;
}